

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_tell.c
# Opt level: O0

zip_int64_t zip_source_tell(zip_source_t *src)

{
  zip_source_t *src_local;
  
  if ((src->source_closed & 1U) == 0) {
    if (src->open_count == 0) {
      zip_error_set(&src->error,0x12,0);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else if ((src->supports & 0xc0U) == 0) {
      if (src->bytes_read < 0x8000000000000000) {
        src_local = (zip_source_t *)src->bytes_read;
      }
      else {
        zip_error_set(&src->error,0x1e,0x4b);
        src_local = (zip_source_t *)0xffffffffffffffff;
      }
    }
    else {
      src_local = (zip_source_t *)_zip_source_call(src,(void *)0x0,0,ZIP_SOURCE_TELL);
    }
  }
  else {
    src_local = (zip_source_t *)0xffffffffffffffff;
  }
  return (zip_int64_t)src_local;
}

Assistant:

ZIP_EXTERN zip_int64_t
zip_source_tell(zip_source_t *src) {
    if (src->source_closed) {
        return -1;
    }
    if (!ZIP_SOURCE_IS_OPEN_READING(src)) {
        zip_error_set(&src->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if ((src->supports & (ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_TELL) | ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_SEEK))) == 0) {
        if (src->bytes_read > ZIP_INT64_MAX) {
            zip_error_set(&src->error, ZIP_ER_TELL, EOVERFLOW);
            return -1;
        }
        return (zip_int64_t)src->bytes_read;
    }

    return _zip_source_call(src, NULL, 0, ZIP_SOURCE_TELL);
}